

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O0

float mat_get(ggml_tensor *t,int i0,int i1,int i2,int i3)

{
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb0;
  int i3_local;
  int i2_local;
  int i1_local;
  int i0_local;
  ggml_tensor *t_local;
  
  return *(float *)((long)t->data +
                   (long)i3 * t->nb[3] +
                   (long)i2 * t->nb[2] + (long)i1 * t->nb[1] + (long)i0 * t->nb[0]);
}

Assistant:

float mat_get(const struct ggml_tensor * t, int i0, int i1, int i2, int i3) {
    const size_t nb0 = t->nb[0];
    const size_t nb1 = t->nb[1];
    const size_t nb2 = t->nb[2];
    const size_t nb3 = t->nb[3];

    return
        *((float*) ((char*)t->data + i0*nb0 + i1*nb1 + i2*nb2 + i3*nb3));
}